

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

ch_closure * ch_loadclosure(ch_function *function,uint8_t upvalue_count)

{
  ch_upvalue **ppcVar1;
  ch_closure *pcVar2;
  ch_closure *closure;
  uint8_t i;
  ch_upvalue **upvalues;
  uint8_t upvalue_count_local;
  ch_function *function_local;
  
  ppcVar1 = (ch_upvalue **)malloc((ulong)upvalue_count << 3);
  for (closure._7_1_ = 0; closure._7_1_ < upvalue_count; closure._7_1_ = closure._7_1_ + 1) {
    ppcVar1[closure._7_1_] = (ch_upvalue *)0x0;
  }
  pcVar2 = (ch_closure *)malloc(0x20);
  pcVar2->function = function;
  (pcVar2->object).type = TYPE_CLOSURE;
  pcVar2->upvalues = ppcVar1;
  pcVar2->upvalue_count = upvalue_count;
  return pcVar2;
}

Assistant:

ch_closure *ch_loadclosure(ch_function* function, uint8_t upvalue_count) {
  ch_upvalue** upvalues = malloc(sizeof(ch_upvalue*) * upvalue_count);
  for(uint8_t i = 0; i < upvalue_count; i++) {
    upvalues[i] = NULL;
  }

  ch_closure *closure = malloc(sizeof(ch_closure));
  closure->function = function;
  closure->object.type = TYPE_CLOSURE;
  closure->upvalues = upvalues;
  closure->upvalue_count = upvalue_count;

  return closure;
}